

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawMaybeAliased
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  uint8 *puVar1;
  
  if (this->aliasing_enabled_ == true) {
    puVar1 = WriteAliasedRaw(this,data,size,ptr);
    return puVar1;
  }
  puVar1 = WriteRaw(this,data,size,ptr);
  return puVar1;
}

Assistant:

uint8* WriteRawMaybeAliased(const void* data, int size, uint8* ptr) {
    if (aliasing_enabled_) {
      return WriteAliasedRaw(data, size, ptr);
    } else {
      return WriteRaw(data, size, ptr);
    }
  }